

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cc
# Opt level: O3

int BIO_printf(BIO *bio,char *format,...)

{
  char in_AL;
  uint len;
  int iVar1;
  uint uVar2;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char buf [256];
  undefined8 local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  char local_138 [264];
  
  if (in_AL != '\0') {
    local_1b8 = in_XMM0_Qa;
    local_1a8 = in_XMM1_Qa;
    local_198 = in_XMM2_Qa;
    local_188 = in_XMM3_Qa;
    local_178 = in_XMM4_Qa;
    local_168 = in_XMM5_Qa;
    local_158 = in_XMM6_Qa;
    local_148 = in_XMM7_Qa;
  }
  local_208 = 0x3000000010;
  local_200 = &stack0x00000008;
  local_1f8 = local_1e8;
  local_1d8 = in_RDX;
  local_1d0 = in_RCX;
  local_1c8 = in_R8;
  local_1c0 = in_R9;
  len = vsnprintf(local_138,0x100,format,&local_208);
  iVar1 = -1;
  if (-1 < (int)len) {
    if (len < 0x100) {
      iVar1 = BIO_write(bio,local_138,len);
    }
    else {
      __s = (char *)OPENSSL_malloc((ulong)(len + 1));
      if (__s != (char *)0x0) {
        local_200 = &stack0x00000008;
        local_208 = 0x3000000010;
        local_1f8 = local_1e8;
        uVar2 = vsnprintf(__s,(ulong)(len + 1),format,&local_208);
        if (uVar2 != len) {
          __assert_fail("out_len == (int)requested_len",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/printf.cc"
                        ,0x30,"int BIO_printf(BIO *, const char *, ...)");
        }
        iVar1 = BIO_write(bio,__s,len);
        OPENSSL_free(__s);
      }
    }
  }
  return iVar1;
}

Assistant:

int BIO_printf(BIO *bio, const char *format, ...) {
  va_list args;
  char buf[256], *out, out_malloced = 0;
  int out_len, ret;

  va_start(args, format);
  out_len = vsnprintf(buf, sizeof(buf), format, args);
  va_end(args);
  if (out_len < 0) {
    return -1;
  }

  if ((size_t)out_len >= sizeof(buf)) {
    const size_t requested_len = (size_t)out_len;
    // The output was truncated. Note that vsnprintf's return value does not
    // include a trailing NUL, but the buffer must be sized for it.
    out = reinterpret_cast<char *>(OPENSSL_malloc(requested_len + 1));
    out_malloced = 1;
    if (out == NULL) {
      return -1;
    }
    va_start(args, format);
    out_len = vsnprintf(out, requested_len + 1, format, args);
    va_end(args);
    assert(out_len == (int)requested_len);
  } else {
    out = buf;
  }

  ret = BIO_write(bio, out, out_len);
  if (out_malloced) {
    OPENSSL_free(out);
  }

  return ret;
}